

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highwayhash.cpp
# Opt level: O0

size_t __thiscall groundupdbext::HighwayHash::operator()(HighwayHash *this,char *data,size_t length)

{
  size_t length_local;
  char *data_local;
  HighwayHash *this_local;
  
  highwayhash::HighwayHashCatT<1U>::Reset(this->m_hh,this->m_key);
  highwayhash::HighwayHashCatT<1U>::Append(this->m_hh,data,length);
  highwayhash::HighwayHashCatT<1U>::Finalize<unsigned_long>(this->m_hh,this->m_result);
  return *this->m_result;
}

Assistant:

std::size_t
HighwayHash::operator() (const char* data,std::size_t length) const noexcept {
  m_hh->Reset(m_key);
  m_hh->Append(data, length);
  m_hh->Finalize(m_result);
  return *m_result;
}